

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void * __thiscall tetgenmesh::memorypool::traverse(memorypool *this)

{
  uintptr_t alignptr;
  void *newitem;
  memorypool *this_local;
  
  if (this->pathitem == this->nextitem) {
    this_local = (memorypool *)0x0;
  }
  else {
    if (this->pathitemsleft == 0) {
      this->pathblock = (void **)*this->pathblock;
      this->pathitem =
           (void *)((long)(this->pathblock + 1) +
                   ((long)this->alignbytes -
                   (ulong)(this->pathblock + 1) % (ulong)(long)this->alignbytes));
      this->pathitemsleft = this->itemsperblock;
    }
    this_local = (memorypool *)this->pathitem;
    this->pathitem = (void *)((long)this->pathitem + (long)this->itembytes);
    this->pathitemsleft = this->pathitemsleft + -1;
  }
  return this_local;
}

Assistant:

void* tetgenmesh::memorypool::traverse()
{
  void *newitem;
  uintptr_t alignptr;

  // Stop upon exhausting the list of items.
  if (pathitem == nextitem) {
    return (void *) NULL;
  }
  // Check whether any untraversed items remain in the current block.
  if (pathitemsleft == 0) {
    // Find the next block.
    pathblock = (void **) *pathblock;
    // Find the first item in the block.  Increment by the size of (void *).
    alignptr = (uintptr_t) (pathblock + 1);
    // Align with item on an `alignbytes'-byte boundary.
    pathitem = (void *)
      (alignptr + (uintptr_t) alignbytes -
       (alignptr % (uintptr_t) alignbytes));
    // Set the number of items left in the current block.
    pathitemsleft = itemsperblock;
  }
  newitem = pathitem;
  // Find the next item in the block.
  pathitem = (void *) ((uintptr_t) pathitem + itembytes);
  pathitemsleft--;
  return newitem;
}